

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

string * __thiscall
ctemplate::(anonymous_namespace)::PrettyPrintTokenModifiers_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *modvals
          )

{
  ModifierAndValue *extraout_RDX;
  ModifierAndValue *extraout_RDX_00;
  ctemplate *this_00;
  string one_mod;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = *(ctemplate **)this;
  if (this_00 != *(ctemplate **)(this + 8)) {
    do {
      PrettyPrintOneModifier_abi_cxx11_(&local_50,this_00,(ModifierAndValue *)modvals);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      modvals = (vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *
                )extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
        modvals = (vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                   *)extraout_RDX_00;
      }
      this_00 = this_00 + 0x18;
    } while (this_00 != *(ctemplate **)(this + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

static string PrettyPrintTokenModifiers(
    const vector<ModifierAndValue>& modvals) {
  string out;
  for (vector<ModifierAndValue>::const_iterator it =
           modvals.begin(); it != modvals.end();  ++it) {
    string one_mod = PrettyPrintOneModifier(*it);
    out.append(one_mod);
  }
  return out;
}